

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

int Cbs_ManSolve(Cbs_Man_t *p,Gia_Obj_t *pObj)

{
  int *piVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pVar;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  
  s_Counter = 0;
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3b7,"int Cbs_ManSolve(Cbs_Man_t *, Gia_Obj_t *)");
  }
  if (((p->pJust).iHead == 0) && ((p->pJust).iTail == 0)) {
    if (((p->pClauses).iHead == 1) && ((p->pClauses).iTail == 1)) {
      (p->Pars).nJustThis = 0;
      (p->Pars).nBTThis = 0;
      (p->Pars).nBTThisNc = 0;
      Cbs_ManAssign(p,pObj,0,(Gia_Obj_t *)0x0,(Gia_Obj_t *)0x0);
      iVar4 = Cbs_ManSolve_rec(p,0);
      uVar7 = 1;
      if (iVar4 == 0) {
        iVar4 = Cbs_ManCheckLimits(p);
        if (iVar4 == 0) {
          p_00 = p->vModel;
          p_00->nSize = 0;
          (p->pProp).iHead = 0;
          uVar7 = 0;
          for (lVar6 = 0;
              (lVar6 < (p->pProp).iTail &&
              (pVar = (p->pProp).pData[lVar6], pVar != (Gia_Obj_t *)0x0)); lVar6 = lVar6 + 1) {
            uVar3 = *(undefined8 *)pVar;
            if ((~(uint)uVar3 & 0x9fffffff) == 0) {
              uVar5 = Cbs_VarValue(pVar);
              iVar4 = Abc_Var2Lit((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff,uVar5 ^ 1);
              Vec_IntPush(p_00,iVar4);
            }
          }
        }
      }
      Cbs_ManCancelUntil(p,0);
      (p->pJust).iHead = 0;
      (p->pJust).iTail = 0;
      (p->pClauses).iHead = 1;
      (p->pClauses).iTail = 1;
      iVar4 = (p->Pars).nJustThis;
      piVar1 = &(p->Pars).nBTTotal;
      *piVar1 = *piVar1 + (p->Pars).nBTThis;
      iVar2 = (p->Pars).nJustTotal;
      if (iVar4 < iVar2) {
        iVar4 = iVar2;
      }
      (p->Pars).nJustTotal = iVar4;
      iVar4 = Cbs_ManCheckLimits(p);
      return -(uint)(iVar4 != 0) | uVar7;
    }
    __assert_fail("p->pClauses.iHead == 1 && p->pClauses.iTail == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x3b9,"int Cbs_ManSolve(Cbs_Man_t *, Gia_Obj_t *)");
  }
  __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                ,0x3b8,"int Cbs_ManSolve(Cbs_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Cbs_ManSolve( Cbs_Man_t * p, Gia_Obj_t * pObj )
{
    int RetValue = 0;
    s_Counter = 0;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    assert( p->pClauses.iHead == 1 && p->pClauses.iTail == 1 );
    p->Pars.nBTThis = p->Pars.nJustThis = p->Pars.nBTThisNc = 0;
    Cbs_ManAssign( p, pObj, 0, NULL, NULL );
    if ( !Cbs_ManSolve_rec(p, 0) && !Cbs_ManCheckLimits(p) )
        Cbs_ManSaveModel( p, p->vModel );
    else
        RetValue = 1;
    Cbs_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->pClauses.iHead = p->pClauses.iTail = 1;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs_ManCheckLimits( p ) )
        RetValue = -1;
//    printf( "%d ", s_Counter );
    return RetValue;
}